

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3eca4::reportTypeMismatch
          (anon_unknown_dwarf_3eca4 *this,bool *valid,char *kind,Importable *import)

{
  ostream *poVar1;
  Name name;
  Name name_00;
  Name name_01;
  
  *this = (anon_unknown_dwarf_3eca4)0x0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Type mismatch when importing ");
  poVar1 = std::operator<<(poVar1,valid);
  poVar1 = std::operator<<(poVar1," ");
  name.super_IString.str._M_str = (char *)import;
  name.super_IString.str._M_len = *(size_t *)(kind + 0x30);
  poVar1 = wasm::operator<<((wasm *)poVar1,*(ostream **)(kind + 0x28),name);
  poVar1 = std::operator<<(poVar1," from module ");
  name_00.super_IString.str._M_str = (char *)import;
  name_00.super_IString.str._M_len = *(size_t *)(kind + 0x20);
  poVar1 = wasm::operator<<((wasm *)poVar1,*(ostream **)(kind + 0x18),name_00);
  poVar1 = std::operator<<(poVar1," ($");
  name_01.super_IString.str._M_str = (char *)import;
  name_01.super_IString.str._M_len = *(size_t *)(kind + 8);
  poVar1 = wasm::operator<<((wasm *)poVar1,*(ostream **)kind,name_01);
  std::operator<<(poVar1,"): ");
  return;
}

Assistant:

void reportTypeMismatch(bool& valid, const char* kind, Importable* import) {
  valid = false;
  std::cerr << "Type mismatch when importing " << kind << " " << import->base
            << " from module " << import->module << " ($" << import->name
            << "): ";
}